

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

GroupSizes __thiscall QLocaleData::groupSizes(QLocaleData *this)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  QLocaleData *in_RDI;
  long in_FS_OFFSET;
  GroupSizes GVar3;
  GroupSizes sysGroupSizes;
  QVariant queryResult;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QVariant *in_stack_ffffffffffffff38;
  undefined8 local_58;
  uint local_50;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == &systemLocaleData) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4c9245);
    (*pQVar2->_vptr_QSystemLocale[2])(&local_28,pQVar2,3,local_48);
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    bVar1 = ::QVariant::isNull(in_stack_ffffffffffffff38);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      GVar3 = ::QVariant::value<QLocaleData::GroupSizes>(in_stack_ffffffffffffff38);
      local_50 = GVar3.least;
      local_58._0_4_ = GVar3.first;
      bVar1 = (int)local_58 < 1;
      local_58 = GVar3._0_8_;
      if (bVar1) {
        local_58._4_4_ = GVar3.higher;
        local_58 = CONCAT44(local_58._4_4_,(uint)systemLocaleData._120_4_ >> 0xe) &
                   0xffffffff00000003;
      }
      if (local_58._4_4_ < 1) {
        local_58 = CONCAT44((uint)systemLocaleData._120_4_ >> 0x10,(int)local_58) & 0x7ffffffff;
      }
      if ((int)local_50 < 1) {
        local_50 = (uint)systemLocaleData._120_4_ >> 0x13 & 7;
      }
      bVar1 = true;
    }
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (bVar1) goto LAB_004c940f;
  }
  local_58 = CONCAT44(*(uint *)&in_RDI->field_0x78 >> 0x10,*(uint *)&in_RDI->field_0x78 >> 0xe) &
             0x700000003;
  local_50 = *(uint *)&in_RDI->field_0x78 >> 0x13 & 7;
LAB_004c940f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  GVar3.least = local_50;
  GVar3.first = (int)local_58;
  GVar3.higher = local_58._4_4_;
  return GVar3;
}

Assistant:

QLocaleData::GroupSizes QLocaleData::groupSizes() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (this == &systemLocaleData) {
        QVariant queryResult = systemLocale()->query(QSystemLocale::Grouping);
        if (!queryResult.isNull()) {
            QLocaleData::GroupSizes sysGroupSizes =
                    queryResult.value<QLocaleData::GroupSizes>();
            if (sysGroupSizes.first <= 0)
                sysGroupSizes.first = m_grouping_first;
            if (sysGroupSizes.higher <= 0)
                sysGroupSizes.higher = m_grouping_higher;
            if (sysGroupSizes.least <= 0)
                sysGroupSizes.least = m_grouping_least;
            return sysGroupSizes;
        }
    }
#endif
    return { m_grouping_first,
             m_grouping_higher,
             m_grouping_least };
}